

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::scoped_dfs_traverser::return_to_outermost_scope(scoped_dfs_traverser *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference m;
  scoped_dfs_traverser *this_local;
  
  group::depth_first_traverser::invalidate(&this->posAfterLastMatch_);
  bVar1 = std::
          stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
          ::empty(&this->scopes_);
  if (bVar1) {
    group::depth_first_traverser::invalidate(&this->pos_);
    this->repeatGroupContinues_ = false;
  }
  else {
    while( true ) {
      bVar2 = std::
              stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
              ::empty(&this->scopes_);
      bVar1 = false;
      if (!bVar2) {
        bVar2 = group::depth_first_traverser::operator_cast_to_bool(&this->pos_);
        bVar1 = true;
        if (bVar2) {
          iVar3 = group::depth_first_traverser::level(&this->pos_);
          bVar1 = 0 < iVar3;
        }
      }
      if (!bVar1) break;
      m = std::
          stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
          ::top(&this->scopes_);
      group::depth_first_traverser::undo(&this->pos_,m);
      std::
      stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
      ::pop(&this->scopes_);
    }
    while (bVar1 = std::
                   stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                   ::empty(&this->scopes_), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
      ::pop(&this->scopes_);
    }
    bVar1 = repeat_group_continues(this);
    this->repeatGroupContinues_ = bVar1;
  }
  return;
}

Assistant:

void return_to_outermost_scope()
    {
        posAfterLastMatch_.invalidate();

        if(scopes_.empty()) {
            pos_.invalidate();
            repeatGroupContinues_ = false;
            return;
        }

        while(!scopes_.empty() && (!pos_ || pos_.level() >= 1)) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        while(!scopes_.empty()) scopes_.pop();

        repeatGroupContinues_ = repeat_group_continues();
    }